

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_context_setIntrinsicPrimitiveMethod
          (sysbvm_context_t *context,sysbvm_tuple_t ownerClass,char *selectorString,
          size_t argumentCount,sysbvm_bitflags_t flags,void *userdata,
          sysbvm_functionEntryPoint_t entryPoint)

{
  sysbvm_stackFrameRecord_t local_78;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 local_58;
  sysbvm_tuple_t sStack_50;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t local_40;
  
  local_60 = &local_58;
  local_58 = 0;
  sStack_50 = 0;
  local_48 = 0;
  local_78.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_78.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_78._12_4_ = 0;
  local_68 = 4;
  local_40 = ownerClass;
  sysbvm_stackFrame_pushRecord(&local_78);
  local_48 = sysbvm_function_createPrimitive(context,argumentCount,flags,userdata,entryPoint);
  sStack_50 = sysbvm_symbol_internWithCString(context,selectorString);
  sysbvm_type_setMethodWithSelector(context,local_40,sStack_50,local_48);
  sysbvm_stackFrame_popRecord(&local_78);
  return local_48;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_setIntrinsicPrimitiveMethod(sysbvm_context_t *context, sysbvm_tuple_t ownerClass, const char *selectorString, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    struct {
        sysbvm_tuple_t symbol;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t primitiveFunction;
        sysbvm_tuple_t ownerClass;
    } gcFrame = {
        .ownerClass = ownerClass
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.primitiveFunction = sysbvm_function_createPrimitive(context, argumentCount, flags, userdata, entryPoint);
    gcFrame.selector = sysbvm_symbol_internWithCString(context, selectorString);
    sysbvm_type_setMethodWithSelector(context, gcFrame.ownerClass, gcFrame.selector, gcFrame.primitiveFunction);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.primitiveFunction;
}